

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilSort.c
# Opt level: O0

void Abc_QuickSort1(word *pData,int nSize,int fDecrease)

{
  int fVerify;
  int i;
  int fDecrease_local;
  int nSize_local;
  word *pData_local;
  
  if (fDecrease == 0) {
    qsort(pData,(long)nSize,8,Abc_QuickSort1CompareInc);
  }
  else {
    qsort(pData,(long)nSize,8,Abc_QuickSort1CompareDec);
  }
  return;
}

Assistant:

void Abc_QuickSort1( word * pData, int nSize, int fDecrease )
{
    int i, fVerify = 0;
    if ( fDecrease )
    {
        qsort( (void *)pData, nSize, sizeof(word), (int (*)(const void *, const void *))Abc_QuickSort1CompareDec );
        if ( fVerify )
            for ( i = 1; i < nSize; i++ )
                assert( (unsigned)pData[i-1] >= (unsigned)pData[i] );
    }
    else
    {
        qsort( (void *)pData, nSize, sizeof(word), (int (*)(const void *, const void *))Abc_QuickSort1CompareInc );
        if ( fVerify )
            for ( i = 1; i < nSize; i++ )
                assert( (unsigned)pData[i-1] <= (unsigned)pData[i] );
    }
}